

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

xcb_void_cookie_t
xcb_input_xi_set_client_pointer
          (xcb_connection_t *c,xcb_window_t window,xcb_input_device_id_t deviceid)

{
  uint uVar1;
  ushort in_DX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  xcb_void_cookie_t xcb_ret;
  xcb_input_xi_set_client_pointer_request_t xcb_out;
  iovec xcb_parts [4];
  undefined4 local_58;
  undefined4 uStack_54;
  uint local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0xaaaaaaaa;
  uStack_34 = 0xaaaaaaaa;
  uStack_30 = 0xaaaaaaaa;
  uStack_2c = 0xaaaaaaaa;
  local_48 = 0xaaaaaaaa;
  uStack_44 = 0xaaaaaaaa;
  uStack_40 = 0xaaaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  _local_58 = CONCAT44(in_ESI,0xaaaaaaaa);
  local_50 = (uint)in_DX;
  local_28 = &local_58;
  uStack_20 = 0xc;
  local_18 = 0;
  uStack_10 = 0;
  uVar1 = xcb_send_request(in_RDI,0,&local_28,&xcb_input_xi_set_client_pointer::xcb_req);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (xcb_void_cookie_t)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

xcb_void_cookie_t
xcb_input_xi_set_client_pointer (xcb_connection_t      *c,
                                 xcb_window_t           window,
                                 xcb_input_device_id_t  deviceid)
{
    static const xcb_protocol_request_t xcb_req = {
        .count = 2,
        .ext = &xcb_input_id,
        .opcode = XCB_INPUT_XI_SET_CLIENT_POINTER,
        .isvoid = 1
    };

    struct iovec xcb_parts[4];
    xcb_void_cookie_t xcb_ret;
    xcb_input_xi_set_client_pointer_request_t xcb_out;

    xcb_out.window = window;
    xcb_out.deviceid = deviceid;
    memset(xcb_out.pad0, 0, 2);

    xcb_parts[2].iov_base = (char *) &xcb_out;
    xcb_parts[2].iov_len = sizeof(xcb_out);
    xcb_parts[3].iov_base = 0;
    xcb_parts[3].iov_len = -xcb_parts[2].iov_len & 3;

    xcb_ret.sequence = xcb_send_request(c, 0, xcb_parts + 2, &xcb_req);
    return xcb_ret;
}